

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O2

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryRequirements *memReqs,MemoryRequirement requirement)

{
  uint uVar1;
  uint uVar2;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  data;
  bool bVar3;
  HostPtr *this_00;
  SimpleAllocation *this_01;
  NotSupportedError *this_02;
  VkDeviceSize in_R9;
  deUint32 memoryTypeNdx;
  ulong uVar4;
  VkMemoryMapFlags in_stack_ffffffffffffff28;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_b8;
  Move<vk::Handle<(vk::HandleType)7>_> mem;
  VkMemoryAllocateInfo allocInfo;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_68;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_58;
  
  uVar1 = memReqs->memoryTypeBits;
  uVar2 = (this->m_memProps).memoryTypeCount;
  uVar4 = 0;
  allocInfo.sType = requirement.m_flags;
  do {
    if (uVar2 == uVar4) {
      this_02 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_02,"No compatible memory type found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkMemUtil.cpp"
                 ,0x57);
      __cxa_throw(this_02,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((uVar1 >> ((uint)uVar4 & 0x1f) & 1) != 0) {
      bVar3 = MemoryRequirement::matchesHeap
                        ((MemoryRequirement *)&allocInfo,
                         (this->m_memProps).memoryTypes[uVar4].propertyFlags);
      if (bVar3) {
        allocInfo.sType = VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO;
        allocInfo.pNext = (void *)0x0;
        allocInfo.allocationSize = memReqs->size;
        allocInfo.memoryTypeIndex = (uint)uVar4;
        allocateMemory(&mem,this->m_vk,this->m_device,&allocInfo,(VkAllocationCallbacks *)0x0);
        hostPtr.
        super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
        .m_data.ptr = (HostPtr *)0x0;
        if ((requirement.m_flags & 1) != 0) {
          this_00 = (HostPtr *)operator_new(0x20);
          anon_unknown_6::HostPtr::HostPtr
                    (this_00,this->m_vk,this->m_device,
                     (VkDeviceMemory)
                     mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
                     allocInfo.allocationSize,in_R9,in_stack_ffffffffffffff28);
          local_b8.m_data.ptr = (HostPtr *)0x0;
          data.ptr._4_4_ = requirement.m_flags;
          data.ptr._0_4_ = in_stack_ffffffffffffff28;
          data._8_8_ = __return_storage_ptr__;
          de::details::
          MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          ::operator=(&hostPtr,data);
          de::details::
          UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
          ::~UniqueBase(&local_b8);
        }
        this_01 = (SimpleAllocation *)operator_new(0x50);
        local_68.m_data.ptr =
             hostPtr.
             super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             .m_data.ptr;
        local_58.m_data.deleter.m_device =
             mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
        local_58.m_data.deleter.m_allocator =
             mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
        local_58.m_data.object.m_internal =
             mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
        local_58.m_data.deleter.m_deviceIface =
             mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
        hostPtr.
        super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
        .m_data.ptr = (HostPtr *)0x0;
        mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
        mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
        mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        SimpleAllocation::SimpleAllocation
                  (this_01,(Move<vk::Handle<(vk::HandleType)7>_> *)&local_58,
                   (MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                    *)&local_68);
        (__return_storage_ptr__->
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).m_data.ptr =
             (Allocation *)this_01;
        de::details::
        UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
        ::~UniqueBase(&local_68);
        refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_58);
        de::details::
        UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
        ::~UniqueBase(&hostPtr.
                       super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                     );
        refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
                  (&mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
        return __return_storage_ptr__;
      }
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryRequirements& memReqs, MemoryRequirement requirement)
{
	const deUint32				memoryTypeNdx	= selectMatchingMemoryType(m_memProps, memReqs.memoryTypeBits, requirement);
	const VkMemoryAllocateInfo	allocInfo		=
	{
		VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType			sType;
		DE_NULL,								//	const void*				pNext;
		memReqs.size,							//	VkDeviceSize			allocationSize;
		memoryTypeNdx,							//	deUint32				memoryTypeIndex;
	};

	Move<VkDeviceMemory>		mem				= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>			hostPtr;

	if (requirement & MemoryRequirement::HostVisible)
	{
		DE_ASSERT(isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex));
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));
	}

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}